

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlist.c
# Opt level: O2

dlist_t * dlist_ins_after(dlist_head_t *head,dlist_t *dlist,void *data)

{
  dlist_t *new;
  
  if (head == (dlist_head_t *)0x0) {
    __assert_fail("head != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/dlist.c",0x8d,
                  "dlist_t *dlist_ins_after(dlist_head_t *, dlist_t *, void *)");
  }
  if (dlist != (dlist_t *)0x0) {
    new = dlist_new(data);
    if (new != (dlist_t *)0x0) {
      dlist_insl_after(head,dlist,new);
    }
    return new;
  }
  __assert_fail("dlist != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/dlist.c",0x8e,
                "dlist_t *dlist_ins_after(dlist_head_t *, dlist_t *, void *)");
}

Assistant:

dlist_t *dlist_ins_after(dlist_head_t *head, dlist_t *dlist, void *data) {
  assert(head != NULL);
  assert(dlist != NULL);
  
  dlist_t *tmp = dlist_new(data);
  
  if (!tmp)
    return NULL;
  
  if (dlist_insl_after(head, dlist, tmp)) {
    return tmp;
  } else {
    dlist_delete(tmp, NULL);
    return NULL;
  }
}